

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_psbt.cpp
# Opt level: O2

void __thiscall cfd::core::Psbt::Psbt(Psbt *this,string *base64)

{
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> _Stack_28;
  
  CryptoUtil::DecodeBase64((ByteData *)&_Stack_28,(string *)base64);
  Psbt(this,(ByteData *)&_Stack_28);
  ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&_Stack_28);
  return;
}

Assistant:

Psbt::Psbt(const std::string &base64)
    : Psbt(CryptoUtil::DecodeBase64(base64)) {
  // do nothing
}